

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::enclose_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,string *expr)

{
  pointer pcVar1;
  bool bVar2;
  undefined8 in_RAX;
  char *in_R8;
  undefined1 auStack_18 [7];
  spirv_cross local_11;
  
  _auStack_18 = in_RAX;
  bVar2 = needs_enclose_expression(expr);
  if (bVar2) {
    _auStack_18 = CONCAT17(0x28,CONCAT16(0x29,auStack_18._0_6_));
    join<char,std::__cxx11::string_const&,char>
              (__return_storage_ptr__,(spirv_cross *)(auStack_18 + 7),(char *)expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(auStack_18 + 6)
               ,in_R8);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (expr->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + expr->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::enclose_expression(const string &expr)
{
	// If this expression contains any spaces which are not enclosed by parentheses,
	// we need to enclose it so we can treat the whole string as an expression.
	// This happens when two expressions have been part of a binary op earlier.
	if (needs_enclose_expression(expr))
		return join('(', expr, ')');
	else
		return expr;
}